

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haxx_complex_op.hpp
# Opt level: O0

quaternion<double> * HAXX::operator*(quaternion<double> *__x,complex<double> *__y)

{
  complex<double> *in_RDX;
  quaternion<double> *in_RSI;
  quaternion<double> *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  quaternion<double> *__r;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  complex<double> *local_10;
  quaternion<double> *local_8;
  
  local_18 = 0.0;
  local_20 = 0.0;
  local_28 = 0.0;
  local_30 = 0.0;
  local_10 = in_RDX;
  local_8 = in_RSI;
  quaternion<double>::quaternion(in_RDI,&local_18,&local_20,&local_28,&local_30);
  dVar1 = quaternion<double>::real(local_8);
  auVar4._0_8_ = std::complex<double>::real_abi_cxx11_(local_10);
  dVar2 = quaternion<double>::imag_i(local_8);
  dVar3 = std::complex<double>::imag_abi_cxx11_(local_10);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar1;
  auVar4._8_8_ = 0;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = -(dVar2 * dVar3);
  auVar4 = vfmadd213sd_fma(auVar4,auVar8,auVar12);
  quaternion<double>::real(in_RDI,auVar4._0_8_);
  dVar1 = quaternion<double>::real(local_8);
  auVar5._0_8_ = std::complex<double>::imag_abi_cxx11_(local_10);
  dVar2 = quaternion<double>::imag_i(local_8);
  dVar3 = std::complex<double>::real_abi_cxx11_(local_10);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar1;
  auVar5._8_8_ = 0;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar2 * dVar3;
  auVar4 = vfmadd213sd_fma(auVar5,auVar9,auVar13);
  quaternion<double>::imag_i(in_RDI,auVar4._0_8_);
  dVar1 = quaternion<double>::imag_j(local_8);
  auVar6._0_8_ = std::complex<double>::real_abi_cxx11_(local_10);
  dVar2 = quaternion<double>::imag_k(local_8);
  dVar3 = std::complex<double>::imag_abi_cxx11_(local_10);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar1;
  auVar6._8_8_ = 0;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar2 * dVar3;
  auVar4 = vfmadd213sd_fma(auVar6,auVar10,auVar14);
  quaternion<double>::imag_j(in_RDI,auVar4._0_8_);
  dVar1 = quaternion<double>::imag_k(local_8);
  auVar7._0_8_ = std::complex<double>::real_abi_cxx11_(local_10);
  dVar2 = quaternion<double>::imag_j(local_8);
  dVar3 = std::complex<double>::imag_abi_cxx11_(local_10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar1;
  auVar7._8_8_ = 0;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = -(dVar2 * dVar3);
  auVar4 = vfmadd213sd_fma(auVar7,auVar11,auVar15);
  quaternion<double>::imag_k(in_RDI,auVar4._0_8_);
  return in_RDI;
}

Assistant:

inline quaternion<_F> operator*(const quaternion<_F>& __x,
  const std::complex<_F>& __y) {

  quaternion<_F> __r;

  // This is a really naive algorithm
  __r.real(__x.real()   * __y.real()   - __x.imag_i() * __y.imag());
  __r.imag_i(__x.real()   * __y.imag() + __x.imag_i() * __y.real());
  __r.imag_j(__x.imag_j() * __y.real() + __x.imag_k() * __y.imag());
  __r.imag_k(__x.imag_k() * __y.real() - __x.imag_j() * __y.imag());
  
  return __r;

}